

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypergraph.cpp
# Opt level: O0

int __thiscall Hypergraph::extendable(Hypergraph *this,edge *x,edge *y)

{
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *paVar1;
  allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  *this_00;
  allocator<unsigned_long> *this_01;
  pointer *this_02;
  value_type vVar2;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_03;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_04;
  bool bVar3;
  bool bVar4;
  int iVar5;
  size_type sVar6;
  reference pvVar7;
  reference __x;
  reference pvVar8;
  reference rhs;
  reference pdVar9;
  string *local_1418;
  string *local_1360;
  string *local_1270;
  string *local_1198;
  string *local_1068;
  string *local_f88;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_ec2;
  undefined1 local_ec1;
  vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  local_ec0;
  vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  local_ea8;
  vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  local_e90;
  vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  local_e78;
  duration local_e60;
  duration local_e58;
  duration local_e50;
  duration local_e48;
  allocator local_e39;
  string *local_e38;
  string local_e30;
  string local_e10;
  string local_df0 [32];
  string local_dd0;
  string local_db0;
  string local_d90;
  string local_d70;
  string local_d50;
  string local_d30;
  string local_d10;
  string local_cf0;
  string local_cd0;
  iterator local_cb0;
  size_type local_ca8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_ca0;
  time_point local_c88;
  time_point now_5;
  vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  local_c78;
  vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  local_c60;
  vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  local_c48;
  vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  local_c30;
  duration local_c18;
  duration local_c10;
  duration local_c08;
  duration local_c00;
  allocator local_bf1;
  string *local_bf0;
  string local_be8;
  string local_bc8;
  string local_ba8 [32];
  string local_b88;
  string local_b68;
  string local_b48;
  string local_b28;
  string local_b08;
  string local_ae8;
  string local_ac8;
  string local_aa8;
  string local_a88;
  iterator local_a68;
  size_type local_a60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a58;
  time_point local_a40;
  time_point now_4;
  edge e_1;
  iterator __end2;
  iterator __begin2;
  edge_vec *__range2;
  ulong uStack_9f8;
  bool all_no_subset;
  size_type i_s;
  undefined1 local_9e8 [6];
  bool increase_next;
  edge w;
  value_type_conflict local_9c0;
  undefined1 local_9b8 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> iteration_position;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_994;
  undefined1 local_993;
  allocator local_992;
  allocator local_991;
  vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  local_990;
  vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  local_978;
  vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  local_960;
  allocator local_942;
  allocator local_941;
  duration local_940;
  duration local_938;
  allocator local_929;
  string *local_928;
  string local_920;
  string local_900;
  string local_8e0 [32];
  string local_8c0;
  string local_8a0 [32];
  string local_880 [32];
  string local_860;
  string local_840;
  string local_820;
  string local_800;
  string local_7e0 [32];
  string local_7c0 [32];
  iterator local_7a0;
  size_type local_798;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_790;
  time_point local_778;
  time_point now_3;
  vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  local_768;
  allocator local_74e;
  allocator local_74d;
  allocator local_74c;
  allocator local_74b;
  allocator local_74a;
  allocator local_749;
  duration local_748;
  duration local_740;
  allocator local_731;
  string *local_730;
  string local_728;
  string local_708;
  string local_6e8 [32];
  string local_6c8;
  string local_6a8 [32];
  string local_688 [32];
  string local_668 [32];
  string local_648 [32];
  string local_628 [32];
  string local_608 [32];
  string local_5e8;
  string local_5c8;
  iterator local_5a8;
  size_type local_5a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_598;
  time_point local_580;
  time_point now_2;
  vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  sx;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  *__range1_1;
  int local_524;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> local_520;
  undefined1 local_500 [8];
  edge intersection;
  edge e;
  iterator __end1;
  iterator __begin1;
  edge_vec *__range1;
  size_type x_index;
  size_type s_index;
  value_type_conflict local_490;
  undefined1 local_488 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> x_index_to_s_index;
  vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  local_468;
  undefined1 local_450 [8];
  vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  s;
  edge_vec t;
  allocator local_418;
  allocator local_417;
  allocator local_416;
  allocator local_415;
  allocator local_414;
  allocator local_413;
  allocator local_412;
  allocator local_411;
  duration local_410;
  duration local_408;
  allocator local_3f9;
  string *local_3f8;
  string local_3f0;
  string local_3d0;
  string local_3b0 [32];
  string local_390;
  string local_370 [32];
  string local_350 [32];
  string local_330 [32];
  string local_310 [32];
  string local_2f0 [32];
  string local_2d0 [32];
  string local_2b0 [32];
  string local_290 [32];
  iterator local_270;
  size_type local_268;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_260;
  time_point local_248;
  time_point now_1;
  allocator local_238;
  allocator local_237;
  allocator local_236;
  allocator local_235;
  allocator local_234;
  allocator local_233;
  allocator local_232;
  allocator local_231;
  duration local_230;
  duration local_228;
  allocator local_219;
  string *local_218;
  string local_210;
  string local_1f0;
  string local_1d0 [32];
  string local_1b0;
  string local_190 [32];
  string local_170 [32];
  string local_150 [32];
  string local_130 [32];
  string local_110 [32];
  string local_f0 [32];
  string local_d0 [32];
  string local_b0 [32];
  iterator local_90;
  size_type local_88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_80;
  time_point local_68;
  time_point now;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> local_50;
  rep local_30;
  edge *local_28;
  edge *y_local;
  edge *x_local;
  Hypergraph *this_local;
  
  local_28 = y;
  y_local = x;
  x_local = (edge *)this;
  if (((this->m_configuration).collect_oracle_statistics & 1U) != 0) {
    local_30 = std::chrono::_V2::system_clock::now();
    (this->m_oracle_timestamp).__d.__r = local_30;
  }
  bVar3 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::none(y_local);
  if (bVar3) {
    boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator~
              (&local_50,local_28);
    bVar3 = is_hitting_set(this,&local_50);
    boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset(&local_50)
    ;
    if (bVar3) {
      if (((this->m_configuration).collect_oracle_statistics & 1U) != 0) {
        local_68.__d.__r = (duration)std::chrono::_V2::system_clock::now();
        now_1.__d.__r._7_1_ = 1;
        local_218 = &local_210;
        edge_to_string_abi_cxx11_(local_218,y_local);
        local_218 = &local_1f0;
        edge_to_string_abi_cxx11_(local_218,local_28);
        local_218 = (string *)local_1d0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1d0,"3",&local_219);
        local_218 = &local_1b0;
        local_228.__r = (this->m_oracle_timestamp).__d.__r;
        local_230 = local_68.__d.__r;
        ns_string_abi_cxx11_(local_218,(time_point)local_228.__r,local_68);
        local_218 = (string *)local_190;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_190,"",&local_231);
        local_218 = (string *)local_170;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_170,"",&local_232);
        local_218 = (string *)local_150;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_150,"",&local_233);
        local_218 = (string *)local_130;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_130,"",&local_234);
        local_218 = (string *)local_110;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_110,"",&local_235);
        local_218 = (string *)local_f0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_f0,"",&local_236);
        local_218 = (string *)local_d0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_d0,"",&local_237);
        local_218 = (string *)local_b0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_b0,"",&local_238);
        now_1.__d.__r._7_1_ = 0;
        local_90 = &local_210;
        local_88 = 0xc;
        paVar1 = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)((long)&now_1.__d.__r + 6);
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::allocator(paVar1);
        __l_04._M_len = local_88;
        __l_04._M_array = local_90;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_80,__l_04,paVar1);
        Table::add_record(&this->m_oracle_stats,&local_80);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_80);
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)((long)&now_1.__d.__r + 6));
        local_f88 = (string *)&local_90;
        do {
          local_f88 = local_f88 + -1;
          std::__cxx11::string::~string((string *)local_f88);
        } while (local_f88 != &local_210);
        std::allocator<char>::~allocator((allocator<char> *)&local_238);
        std::allocator<char>::~allocator((allocator<char> *)&local_237);
        std::allocator<char>::~allocator((allocator<char> *)&local_236);
        std::allocator<char>::~allocator((allocator<char> *)&local_235);
        std::allocator<char>::~allocator((allocator<char> *)&local_234);
        std::allocator<char>::~allocator((allocator<char> *)&local_233);
        std::allocator<char>::~allocator((allocator<char> *)&local_232);
        std::allocator<char>::~allocator((allocator<char> *)&local_231);
        std::allocator<char>::~allocator((allocator<char> *)&local_219);
      }
      this_local._4_4_ = 1;
    }
    else {
      if (((this->m_configuration).collect_oracle_statistics & 1U) != 0) {
        local_248.__d.__r = (duration)std::chrono::_V2::system_clock::now();
        t.
        super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
        local_3f8 = &local_3f0;
        edge_to_string_abi_cxx11_(local_3f8,y_local);
        local_3f8 = &local_3d0;
        edge_to_string_abi_cxx11_(local_3f8,local_28);
        local_3f8 = (string *)local_3b0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_3b0,"4",&local_3f9);
        local_3f8 = &local_390;
        local_408.__r = (this->m_oracle_timestamp).__d.__r;
        local_410 = local_248.__d.__r;
        ns_string_abi_cxx11_(local_3f8,(time_point)local_408.__r,local_248);
        local_3f8 = (string *)local_370;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_370,"",&local_411);
        local_3f8 = (string *)local_350;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_350,"",&local_412);
        local_3f8 = (string *)local_330;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_330,"",&local_413);
        local_3f8 = (string *)local_310;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_310,"",&local_414);
        local_3f8 = (string *)local_2f0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_2f0,"",&local_415);
        local_3f8 = (string *)local_2d0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_2d0,"",&local_416);
        local_3f8 = (string *)local_2b0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_2b0,"",&local_417);
        local_3f8 = (string *)local_290;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_290,"",&local_418);
        t.
        super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
        local_270 = &local_3f0;
        local_268 = 0xc;
        paVar1 = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)((long)&t.
                            super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage + 6);
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::allocator(paVar1);
        __l_03._M_len = local_268;
        __l_03._M_array = local_270;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_260,__l_03,paVar1);
        Table::add_record(&this->m_oracle_stats,&local_260);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_260);
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)((long)&t.
                                super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage + 6));
        local_1068 = (string *)&local_270;
        do {
          local_1068 = local_1068 + -1;
          std::__cxx11::string::~string((string *)local_1068);
        } while (local_1068 != &local_3f0);
        std::allocator<char>::~allocator((allocator<char> *)&local_418);
        std::allocator<char>::~allocator((allocator<char> *)&local_417);
        std::allocator<char>::~allocator((allocator<char> *)&local_416);
        std::allocator<char>::~allocator((allocator<char> *)&local_415);
        std::allocator<char>::~allocator((allocator<char> *)&local_414);
        std::allocator<char>::~allocator((allocator<char> *)&local_413);
        std::allocator<char>::~allocator((allocator<char> *)&local_412);
        std::allocator<char>::~allocator((allocator<char> *)&local_411);
        std::allocator<char>::~allocator((allocator<char> *)&local_3f9);
      }
      this_local._4_4_ = 0;
    }
  }
  else {
    std::
    vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ::vector((vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
              *)&s.
                 super__Vector_base<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
    sVar6 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::count(y_local);
    local_468.
    super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_468.
    super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_468.
    super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ::vector(&local_468);
    this_00 = (allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
               *)((long)&x_index_to_s_index.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 7);
    std::
    allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
    ::allocator(this_00);
    std::
    vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
    ::vector((vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
              *)local_450,sVar6,&local_468,this_00);
    std::
    allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
    ::~allocator((allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                  *)((long)&x_index_to_s_index.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    std::
    vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ::~vector(&local_468);
    iVar5 = this->m_num_vertices;
    local_490 = 0xffffffffffffffff;
    std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)((long)&s_index + 7));
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_488,(long)iVar5,
               &local_490,(allocator<unsigned_long> *)((long)&s_index + 7));
    std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)((long)&s_index + 7));
    x_index = 0xffffffffffffffff;
    for (__range1 = (edge_vec *)
                    boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::find_first
                              (y_local); __range1 != (edge_vec *)0xffffffffffffffff;
        __range1 = (edge_vec *)
                   boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::find_next
                             (y_local,(size_type)__range1)) {
      x_index = x_index + 1;
      pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_488,
                          (size_type)__range1);
      *pvVar7 = x_index;
    }
    __end1 = std::
             vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             ::begin(&this->m_edges);
    e.m_num_bits = (size_type)
                   std::
                   vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   ::end(&this->m_edges);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                                       *)&e.m_num_bits), bVar3) {
      pdVar9 = __gnu_cxx::
               __normal_iterator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
               ::operator*(&__end1);
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
                ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                 &intersection.m_num_bits,pdVar9);
      boost::operator&((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)local_500,
                       (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                       &intersection.m_num_bits,y_local);
      bVar3 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::none
                        ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)local_500)
      ;
      if (bVar3) {
        boost::operator-(&local_520,
                         (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                         &intersection.m_num_bits,local_28);
        std::
        vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
        ::push_back((vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                     *)&s.
                        super__Vector_base<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_520);
        boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
                  (&local_520);
        local_524 = 6;
      }
      else {
        sVar6 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::count
                          ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                           local_500);
        if (sVar6 == 1) {
          sVar6 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::find_first
                            ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                             local_500);
          pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_488,
                              sVar6);
          pvVar8 = std::
                   vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                   ::operator[]((vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                 *)local_450,*pvVar7);
          boost::operator-((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                           &__range1_1,
                           (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                           &intersection.m_num_bits,local_28);
          std::
          vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
          ::push_back(pvVar8,(value_type *)&__range1_1);
          boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
                    ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)&__range1_1);
        }
        local_524 = 0;
      }
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
                ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)local_500);
      if (local_524 == 0) {
        local_524 = 0;
      }
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
                ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                 &intersection.m_num_bits);
      __gnu_cxx::
      __normal_iterator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
      ::operator++(&__end1);
    }
    __end1_1 = std::
               vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
               ::begin((vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                        *)local_450);
    sx.
    super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)std::
                  vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                  ::end((vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                         *)local_450);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end1_1,
                              (__normal_iterator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_*,_std::vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>
                               *)&sx.
                                  super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage), bVar3) {
      __x = __gnu_cxx::
            __normal_iterator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_*,_std::vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>
            ::operator*(&__end1_1);
      std::
      vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ::vector((vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                *)&now_2,__x);
      bVar3 = std::
              vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
              ::empty((vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                       *)&now_2);
      if (bVar3) {
        if (((this->m_configuration).collect_oracle_statistics & 1U) != 0) {
          local_580.__d.__r = (duration)std::chrono::_V2::system_clock::now();
          now_3.__d.__r._7_1_ = 1;
          local_730 = &local_728;
          edge_to_string_abi_cxx11_(local_730,y_local);
          local_730 = &local_708;
          edge_to_string_abi_cxx11_(local_730,local_28);
          local_730 = (string *)local_6e8;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_6e8,"10",&local_731);
          local_730 = &local_6c8;
          local_740.__r = (this->m_oracle_timestamp).__d.__r;
          local_748 = local_580.__d.__r;
          ns_string_abi_cxx11_(local_730,(time_point)local_740.__r,local_580);
          local_730 = (string *)local_6a8;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_6a8,"",&local_749);
          local_730 = (string *)local_688;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_688,"",&local_74a);
          local_730 = (string *)local_668;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_668,"",&local_74b);
          local_730 = (string *)local_648;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_648,"0",&local_74c);
          local_730 = (string *)local_628;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_628,"0",&local_74d);
          local_730 = (string *)local_608;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_608,"0",&local_74e);
          local_730 = &local_5e8;
          sVar6 = std::
                  vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                  ::size((vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                          *)&s.
                             super__Vector_base<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::__cxx11::to_string(&local_5e8,sVar6);
          local_730 = &local_5c8;
          std::
          vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
          ::vector(&local_768,
                   (vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                    *)&s.
                       super__Vector_base<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
          iVar5 = total_number_of_vertices_in_t(this,&local_768);
          std::__cxx11::to_string(&local_5c8,iVar5);
          now_3.__d.__r._7_1_ = 0;
          local_5a8 = &local_728;
          local_5a0 = 0xc;
          paVar1 = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)((long)&now_3.__d.__r + 6);
          std::
          allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::allocator(paVar1);
          __l_02._M_len = local_5a0;
          __l_02._M_array = local_5a8;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&local_598,__l_02,paVar1);
          Table::add_record(&this->m_oracle_stats,&local_598);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_598);
          std::
          allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)((long)&now_3.__d.__r + 6));
          local_1198 = (string *)&local_5a8;
          do {
            local_1198 = local_1198 + -1;
            std::__cxx11::string::~string((string *)local_1198);
          } while (local_1198 != &local_728);
          std::
          vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
          ::~vector(&local_768);
          std::allocator<char>::~allocator((allocator<char> *)&local_74e);
          std::allocator<char>::~allocator((allocator<char> *)&local_74d);
          std::allocator<char>::~allocator((allocator<char> *)&local_74c);
          std::allocator<char>::~allocator((allocator<char> *)&local_74b);
          std::allocator<char>::~allocator((allocator<char> *)&local_74a);
          std::allocator<char>::~allocator((allocator<char> *)&local_749);
          std::allocator<char>::~allocator((allocator<char> *)&local_731);
        }
        this_local._4_4_ = 0;
        local_524 = 1;
      }
      else {
        local_524 = 0;
      }
      std::
      vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ::~vector((vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 *)&now_2);
      if (local_524 != 0) goto LAB_001854a4;
      __gnu_cxx::
      __normal_iterator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_*,_std::vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>
      ::operator++(&__end1_1);
    }
    bVar3 = std::
            vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            ::empty((vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                     *)&s.
                        super__Vector_base<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (bVar3) {
      if (((this->m_configuration).collect_oracle_statistics & 1U) != 0) {
        local_778.__d.__r = (duration)std::chrono::_V2::system_clock::now();
        local_993 = 1;
        local_928 = &local_920;
        edge_to_string_abi_cxx11_(local_928,y_local);
        local_928 = &local_900;
        edge_to_string_abi_cxx11_(local_928,local_28);
        local_928 = (string *)local_8e0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_8e0,"11",&local_929);
        local_928 = &local_8c0;
        local_938.__r = (this->m_oracle_timestamp).__d.__r;
        local_940 = local_778.__d.__r;
        ns_string_abi_cxx11_(local_928,(time_point)local_938.__r,local_778);
        local_928 = (string *)local_8a0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_8a0,"",&local_941);
        local_928 = (string *)local_880;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_880,"",&local_942);
        local_928 = &local_860;
        std::
        vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
        ::vector(&local_960,
                 (vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                  *)local_450);
        iVar5 = maximum_iteration_count(this,&local_960);
        std::__cxx11::to_string(&local_860,iVar5);
        local_928 = &local_840;
        sVar6 = std::
                vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                ::size((vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                        *)local_450);
        std::__cxx11::to_string(&local_840,sVar6);
        local_928 = &local_820;
        std::
        vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
        ::vector(&local_978,
                 (vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                  *)local_450);
        iVar5 = summed_sx_sizes(this,&local_978);
        std::__cxx11::to_string(&local_820,iVar5);
        local_928 = &local_800;
        std::
        vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
        ::vector(&local_990,
                 (vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                  *)local_450);
        iVar5 = total_number_of_vertices_in_s(this,&local_990);
        std::__cxx11::to_string(&local_800,iVar5);
        local_928 = (string *)local_7e0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_7e0,"0",&local_991);
        local_928 = (string *)local_7c0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_7c0,"0",&local_992);
        local_993 = 0;
        local_7a0 = &local_920;
        local_798 = 0xc;
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::allocator(&local_994);
        __l_01._M_len = local_798;
        __l_01._M_array = local_7a0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_790,__l_01,&local_994);
        Table::add_record(&this->m_oracle_stats,&local_790);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_790);
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~allocator(&local_994);
        local_1270 = (string *)&local_7a0;
        do {
          local_1270 = local_1270 + -1;
          std::__cxx11::string::~string((string *)local_1270);
        } while (local_1270 != &local_920);
        std::allocator<char>::~allocator((allocator<char> *)&local_992);
        std::allocator<char>::~allocator((allocator<char> *)&local_991);
        std::
        vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
        ::~vector(&local_990);
        std::
        vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
        ::~vector(&local_978);
        std::
        vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
        ::~vector(&local_960);
        std::allocator<char>::~allocator((allocator<char> *)&local_942);
        std::allocator<char>::~allocator((allocator<char> *)&local_941);
        std::allocator<char>::~allocator((allocator<char> *)&local_929);
      }
      this_local._4_4_ = 2;
      local_524 = 1;
    }
    else {
      if (((this->m_configuration).collect_oracle_statistics & 1U) != 0) {
        this->m_iteration_count = 0;
        iteration_position.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage = (pointer)std::chrono::_V2::system_clock::now();
        (this->m_oracle_bf_timestamp).__d.__r =
             (rep)iteration_position.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
      }
      sVar6 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::count(y_local);
      local_9c0 = 0;
      this_01 = (allocator<unsigned_long> *)((long)&w.m_num_bits + 7);
      std::allocator<unsigned_long>::allocator(this_01);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_9b8,sVar6,&local_9c0
                 ,this_01);
      std::allocator<unsigned_long>::~allocator
                ((allocator<unsigned_long> *)((long)&w.m_num_bits + 7));
      do {
        if (((this->m_configuration).collect_oracle_statistics & 1U) != 0) {
          this->m_iteration_count = this->m_iteration_count + 1;
        }
        iVar5 = this->m_num_vertices;
        std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)((long)&i_s + 7));
        boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
                  ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)local_9e8,
                   (long)iVar5,0,(allocator<unsigned_long> *)((long)&i_s + 7));
        std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)((long)&i_s + 7));
        i_s._6_1_ = 1;
        for (uStack_9f8 = 0;
            sVar6 = std::
                    vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                    ::size((vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                            *)local_450), uStack_9f8 < sVar6; uStack_9f8 = uStack_9f8 + 1) {
          pvVar8 = std::
                   vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                   ::operator[]((vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                 *)local_450,uStack_9f8);
          pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_9b8,
                              uStack_9f8);
          rhs = std::
                vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                ::operator[](pvVar8,*pvVar7);
          boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator|=
                    ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)local_9e8,rhs)
          ;
          if ((i_s._6_1_ & 1) != 0) {
            pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                               ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_9b8,
                                uStack_9f8);
            *pvVar7 = *pvVar7 + 1;
            pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                               ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_9b8,
                                uStack_9f8);
            vVar2 = *pvVar7;
            pvVar8 = std::
                     vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                     ::operator[]((vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                   *)local_450,uStack_9f8);
            sVar6 = std::
                    vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                    ::size(pvVar8);
            if (vVar2 == sVar6) {
              pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_9b8
                                  ,uStack_9f8);
              *pvVar7 = 0;
            }
            else {
              i_s._6_1_ = 0;
            }
          }
        }
        bVar3 = true;
        this_02 = &s.
                   super__Vector_base<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
        __end2 = std::
                 vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 ::begin((vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                          *)this_02);
        e_1.m_num_bits =
             (size_type)
             std::
             vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             ::end((vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                    *)this_02);
        while (bVar4 = __gnu_cxx::operator!=
                                 (&__end2,(__normal_iterator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                                           *)&e_1.m_num_bits), bVar4) {
          pdVar9 = __gnu_cxx::
                   __normal_iterator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                   ::operator*(&__end2);
          boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
                    ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)&now_4,pdVar9)
          ;
          bVar4 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::is_subset_of
                            ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)&now_4
                             ,(dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                              local_9e8);
          if (bVar4) {
            bVar3 = false;
            local_524 = 0xe;
          }
          else {
            local_524 = 0;
          }
          boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
                    ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)&now_4);
          if (local_524 != 0) break;
          __gnu_cxx::
          __normal_iterator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
          ::operator++(&__end2);
        }
        if (bVar3) {
          if (((this->m_configuration).collect_oracle_statistics & 1U) != 0) {
            local_a40.__d.__r = (duration)std::chrono::_V2::system_clock::now();
            now_5.__d.__r._7_1_ = 1;
            local_bf0 = &local_be8;
            edge_to_string_abi_cxx11_(local_bf0,y_local);
            local_bf0 = &local_bc8;
            edge_to_string_abi_cxx11_(local_bf0,local_28);
            local_bf0 = (string *)local_ba8;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_ba8,"14",&local_bf1);
            local_bf0 = &local_b88;
            local_c00.__r = (this->m_oracle_timestamp).__d.__r;
            local_c08 = local_a40.__d.__r;
            ns_string_abi_cxx11_(local_bf0,(time_point)local_c00.__r,local_a40);
            local_bf0 = &local_b68;
            local_c10.__r = (this->m_oracle_bf_timestamp).__d.__r;
            local_c18 = local_a40.__d.__r;
            ns_string_abi_cxx11_(local_bf0,(time_point)local_c10.__r,local_a40);
            local_bf0 = &local_b48;
            std::__cxx11::to_string(local_bf0,this->m_iteration_count);
            local_bf0 = &local_b28;
            std::
            vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
            ::vector(&local_c30,
                     (vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                      *)local_450);
            iVar5 = maximum_iteration_count(this,&local_c30);
            std::__cxx11::to_string(&local_b28,iVar5);
            local_bf0 = &local_b08;
            sVar6 = std::
                    vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                    ::size((vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                            *)local_450);
            std::__cxx11::to_string(&local_b08,sVar6);
            local_bf0 = &local_ae8;
            std::
            vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
            ::vector(&local_c48,
                     (vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                      *)local_450);
            iVar5 = summed_sx_sizes(this,&local_c48);
            std::__cxx11::to_string(&local_ae8,iVar5);
            local_bf0 = &local_ac8;
            std::
            vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
            ::vector(&local_c60,
                     (vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                      *)local_450);
            iVar5 = total_number_of_vertices_in_s(this,&local_c60);
            std::__cxx11::to_string(&local_ac8,iVar5);
            local_bf0 = &local_aa8;
            sVar6 = std::
                    vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                    ::size((vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                            *)&s.
                               super__Vector_base<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
            std::__cxx11::to_string(&local_aa8,sVar6);
            local_bf0 = &local_a88;
            std::
            vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            ::vector(&local_c78,
                     (vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      *)&s.
                         super__Vector_base<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
            iVar5 = total_number_of_vertices_in_t(this,&local_c78);
            std::__cxx11::to_string(&local_a88,iVar5);
            now_5.__d.__r._7_1_ = 0;
            local_a68 = &local_be8;
            local_a60 = 0xc;
            paVar1 = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)((long)&now_5.__d.__r + 6);
            std::
            allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::allocator(paVar1);
            __l_00._M_len = local_a60;
            __l_00._M_array = local_a68;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector(&local_a58,__l_00,paVar1);
            Table::add_record(&this->m_oracle_stats,&local_a58);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_a58);
            std::
            allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)((long)&now_5.__d.__r + 6));
            local_1360 = (string *)&local_a68;
            do {
              local_1360 = local_1360 + -1;
              std::__cxx11::string::~string((string *)local_1360);
            } while (local_1360 != &local_be8);
            std::
            vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            ::~vector(&local_c78);
            std::
            vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
            ::~vector(&local_c60);
            std::
            vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
            ::~vector(&local_c48);
            std::
            vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
            ::~vector(&local_c30);
            std::allocator<char>::~allocator((allocator<char> *)&local_bf1);
          }
          this_local._4_4_ = 1;
          local_524 = 1;
        }
        else if ((i_s._6_1_ & 1) == 0) {
          local_524 = 0;
        }
        else {
          local_524 = 10;
        }
        boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
                  ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)local_9e8);
      } while (local_524 == 0);
      if (local_524 == 10) {
        if (((this->m_configuration).collect_oracle_statistics & 1U) != 0) {
          local_c88.__d.__r = (duration)std::chrono::_V2::system_clock::now();
          local_ec1 = 1;
          local_e38 = &local_e30;
          edge_to_string_abi_cxx11_(local_e38,y_local);
          local_e38 = &local_e10;
          edge_to_string_abi_cxx11_(local_e38,local_28);
          local_e38 = (string *)local_df0;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_df0,"15",&local_e39);
          local_e38 = &local_dd0;
          local_e48.__r = (this->m_oracle_timestamp).__d.__r;
          local_e50 = local_c88.__d.__r;
          ns_string_abi_cxx11_(local_e38,(time_point)local_e48.__r,local_c88);
          local_e38 = &local_db0;
          local_e58.__r = (this->m_oracle_bf_timestamp).__d.__r;
          local_e60 = local_c88.__d.__r;
          ns_string_abi_cxx11_(local_e38,(time_point)local_e58.__r,local_c88);
          local_e38 = &local_d90;
          std::__cxx11::to_string(local_e38,this->m_iteration_count);
          local_e38 = &local_d70;
          std::
          vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
          ::vector(&local_e78,
                   (vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                    *)local_450);
          iVar5 = maximum_iteration_count(this,&local_e78);
          std::__cxx11::to_string(&local_d70,iVar5);
          local_e38 = &local_d50;
          sVar6 = std::
                  vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                  ::size((vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                          *)local_450);
          std::__cxx11::to_string(&local_d50,sVar6);
          local_e38 = &local_d30;
          std::
          vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
          ::vector(&local_e90,
                   (vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                    *)local_450);
          iVar5 = summed_sx_sizes(this,&local_e90);
          std::__cxx11::to_string(&local_d30,iVar5);
          local_e38 = &local_d10;
          std::
          vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
          ::vector(&local_ea8,
                   (vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                    *)local_450);
          iVar5 = total_number_of_vertices_in_s(this,&local_ea8);
          std::__cxx11::to_string(&local_d10,iVar5);
          local_e38 = &local_cf0;
          sVar6 = std::
                  vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                  ::size((vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                          *)&s.
                             super__Vector_base<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::__cxx11::to_string(&local_cf0,sVar6);
          local_e38 = &local_cd0;
          std::
          vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
          ::vector(&local_ec0,
                   (vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                    *)&s.
                       super__Vector_base<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
          iVar5 = total_number_of_vertices_in_t(this,&local_ec0);
          std::__cxx11::to_string(&local_cd0,iVar5);
          local_ec1 = 0;
          local_cb0 = &local_e30;
          local_ca8 = 0xc;
          std::
          allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::allocator(&local_ec2);
          __l._M_len = local_ca8;
          __l._M_array = local_cb0;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&local_ca0,__l,&local_ec2);
          Table::add_record(&this->m_oracle_stats,&local_ca0);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_ca0);
          std::
          allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~allocator(&local_ec2);
          local_1418 = (string *)&local_cb0;
          do {
            local_1418 = local_1418 + -1;
            std::__cxx11::string::~string((string *)local_1418);
          } while (local_1418 != &local_e30);
          std::
          vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
          ::~vector(&local_ec0);
          std::
          vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
          ::~vector(&local_ea8);
          std::
          vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
          ::~vector(&local_e90);
          std::
          vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
          ::~vector(&local_e78);
          std::allocator<char>::~allocator((allocator<char> *)&local_e39);
        }
        this_local._4_4_ = 0;
        local_524 = 1;
      }
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_9b8);
    }
LAB_001854a4:
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_488);
    std::
    vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
    ::~vector((vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
               *)local_450);
    std::
    vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ::~vector((vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               *)&s.
                  super__Vector_base<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  return this_local._4_4_;
}

Assistant:

int Hypergraph::extendable(const edge &x, const edge &y) {
	if (m_configuration.collect_oracle_statistics) m_oracle_timestamp = Clock::now();
	// 2
	if (x.none()) {
		// 3
		if (is_hitting_set(~y)) {
			if (m_configuration.collect_oracle_statistics) {
				auto now = Clock::now();
				m_oracle_stats.add_record({ edge_to_string(x), edge_to_string(y), "3", ns_string(m_oracle_timestamp, now), "", "", "", "", "", "", "", "" });
			}
			return EXTENDABLE;
		}
		// 4
		if (m_configuration.collect_oracle_statistics) {
			auto now = Clock::now();
			m_oracle_stats.add_record({ edge_to_string(x), edge_to_string(y), "4", ns_string(m_oracle_timestamp, now), "", "", "", "", "", "", "", "" });
		}
		return NOT_EXTENDABLE;
	}
	// 5
	edge_vec t;
	// 6
	std::vector<edge_vec> s(x.count(), edge_vec());
	std::vector<std::vector<edge_vec>::size_type> x_index_to_s_index(m_num_vertices, -1);
	std::vector<edge_vec>::size_type s_index = -1;
	for (auto x_index = x.find_first(); x_index != edge::npos; x_index = x.find_next(x_index)) x_index_to_s_index[x_index] = ++s_index;
	// 7
	for (edge e : m_edges) {
		edge intersection = e & x;
		// 9
		if (intersection.none()) {
			t.push_back(e - y);
			continue;
		}
		// 8
		if (intersection.count() == 1) s[x_index_to_s_index[intersection.find_first()]].push_back(e - y);
	}
	// 10
	for (auto sx : s) if (sx.empty()) {
		if (m_configuration.collect_oracle_statistics) {
			auto now = Clock::now();
			m_oracle_stats.add_record({ edge_to_string(x), edge_to_string(y), "10", ns_string(m_oracle_timestamp, now), "", "", "", "0", "0", "0", std::to_string(t.size()), std::to_string(total_number_of_vertices_in_t(t)) });
		}
		return NOT_EXTENDABLE;
	}
	// 11
	if (t.empty()) {
		if (m_configuration.collect_oracle_statistics) {
			auto now = Clock::now();
			m_oracle_stats.add_record({ edge_to_string(x), edge_to_string(y), "11", ns_string(m_oracle_timestamp, now), "", "", std::to_string(maximum_iteration_count(s)), std::to_string(s.size()), std::to_string(summed_sx_sizes(s)), std::to_string(total_number_of_vertices_in_s(s)), "0", "0" });
		}
		return MINIMAL;
	}
	// 12
	if (m_configuration.collect_oracle_statistics) {
		m_iteration_count = 0;
		m_oracle_bf_timestamp = Clock::now();
	}
	std::vector<edge::size_type> iteration_position(x.count(), 0);
	while (true) {
		if (m_configuration.collect_oracle_statistics) m_iteration_count++;
		// 13
		edge w(m_num_vertices);
		bool increase_next = true;
		for (std::vector<edge_vec>::size_type i_s = 0; i_s < s.size(); ++i_s) {
			w |= s[i_s][iteration_position[i_s]];
			if (increase_next) {
				++iteration_position[i_s];
				if (iteration_position[i_s] == s[i_s].size()) iteration_position[i_s] = 0;
				else increase_next = false;
			}
		}
		// 14
		bool all_no_subset = true;
		for (edge e : t) {
			if (e.is_subset_of(w)) {
				all_no_subset = false;
				break;
			}
		}
		if (all_no_subset) {
			if (m_configuration.collect_oracle_statistics) {
				auto now = Clock::now();
				m_oracle_stats.add_record({ edge_to_string(x), edge_to_string(y), "14", ns_string(m_oracle_timestamp, now), ns_string(m_oracle_bf_timestamp, now), std::to_string(m_iteration_count), std::to_string(maximum_iteration_count(s)), std::to_string(s.size()), std::to_string(summed_sx_sizes(s)), std::to_string(total_number_of_vertices_in_s(s)), std::to_string(t.size()), std::to_string(total_number_of_vertices_in_t(t)) });
			}
			return EXTENDABLE;
		}
		if (increase_next) break;
	}
	// 15
	if (m_configuration.collect_oracle_statistics) {
		auto now = Clock::now();
		m_oracle_stats.add_record({ edge_to_string(x), edge_to_string(y), "15", ns_string(m_oracle_timestamp, now), ns_string(m_oracle_bf_timestamp, now), std::to_string(m_iteration_count), std::to_string(maximum_iteration_count(s)), std::to_string(s.size()), std::to_string(summed_sx_sizes(s)), std::to_string(total_number_of_vertices_in_s(s)), std::to_string(t.size()), std::to_string(total_number_of_vertices_in_t(t)) });
	}
	return NOT_EXTENDABLE;
}